

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

CURLcode AllowServerConnect(Curl_easy *data,_Bool *connected)

{
  uint uVar1;
  CURLcode CVar2;
  timediff_t tVar3;
  ulong milli;
  
  *connected = false;
  Curl_infof(data,"Preparing for accepting server on data port");
  Curl_pgrsTime(data,TIMER_STARTACCEPT);
  tVar3 = ftp_timeleft_accept(data);
  if (tVar3 < 0) {
    Curl_failf(data,"Accept timeout occurred while waiting server connect");
    CVar2 = CURLE_FTP_ACCEPT_TIMEOUT;
  }
  else {
    CVar2 = ReceivedServerConnect(data,connected);
    if (CVar2 == CURLE_OK) {
      if (*connected == true) {
        CVar2 = AcceptServerConnect(data);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        CVar2 = InitiateTransfer(data);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
      }
      else {
        uVar1 = (data->set).accepttimeout;
        milli = 60000;
        if (uVar1 != 0) {
          milli = (ulong)uVar1;
        }
        Curl_expire(data,milli,EXPIRE_FTP_ACCEPT);
      }
      CVar2 = CURLE_OK;
    }
  }
  return CVar2;
}

Assistant:

static CURLcode AllowServerConnect(struct Curl_easy *data, bool *connected)
{
  timediff_t timeout_ms;
  CURLcode result = CURLE_OK;

  *connected = FALSE;
  infof(data, "Preparing for accepting server on data port");

  /* Save the time we start accepting server connect */
  Curl_pgrsTime(data, TIMER_STARTACCEPT);

  timeout_ms = ftp_timeleft_accept(data);
  if(timeout_ms < 0) {
    /* if a timeout was already reached, bail out */
    failf(data, "Accept timeout occurred while waiting server connect");
    return CURLE_FTP_ACCEPT_TIMEOUT;
  }

  /* see if the connection request is already here */
  result = ReceivedServerConnect(data, connected);
  if(result)
    return result;

  if(*connected) {
    result = AcceptServerConnect(data);
    if(result)
      return result;

    result = InitiateTransfer(data);
    if(result)
      return result;
  }
  else {
    /* Add timeout to multi handle and break out of the loop */
    Curl_expire(data, data->set.accepttimeout ?
                data->set.accepttimeout: DEFAULT_ACCEPT_TIMEOUT,
                EXPIRE_FTP_ACCEPT);
  }

  return result;
}